

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O3

void __thiscall
CLIntercept::dumpCaptureReplayKernelSource(CLIntercept *this,string *dumpDirectory,cl_kernel kernel)

{
  undefined8 *puVar1;
  ulong uVar2;
  pointer pcVar3;
  bool bVar4;
  uchar *puVar5;
  char cVar6;
  cl_int cVar7;
  undefined8 *puVar8;
  long *plVar9;
  ulong uVar10;
  long *plVar11;
  char cVar12;
  ulong uVar13;
  long lVar14;
  size_t sVar15;
  cl_uint num_devices;
  cl_program program;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string __str_2;
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> binariesData;
  size_t size;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  binaries;
  string sourceCode;
  vector<unsigned_long,_std::allocator<unsigned_long>_> sizes;
  vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_> devices;
  ofstream output;
  uint local_34c;
  cl_program local_348;
  long *local_340;
  long local_338;
  long local_330;
  long lStack_328;
  CLIntercept *local_320;
  undefined8 *local_318;
  undefined8 local_310;
  undefined8 local_308;
  undefined8 uStack_300;
  ulong *local_2f8;
  uint local_2f0;
  undefined4 uStack_2ec;
  ulong local_2e8 [2];
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> local_2d8;
  size_t local_2c0;
  ulong *local_2b8;
  long local_2b0;
  ulong local_2a8 [2];
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_298;
  undefined1 *local_280 [2];
  undefined1 local_270 [16];
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_260;
  vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_> local_248;
  uchar *local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  local_348 = (cl_program)0x0;
  (*(this->m_Dispatch).clGetKernelInfo)(kernel,0x1194,8,&local_348,(size_t *)0x0);
  local_2c0 = 0;
  (*(this->m_Dispatch).clGetProgramInfo)(local_348,0x1164,0,(void *)0x0,&local_2c0);
  local_280[0] = local_270;
  std::__cxx11::string::_M_construct((ulong)local_280,(char)local_2c0);
  cVar7 = (*(this->m_Dispatch).clGetProgramInfo)
                    (local_348,0x1164,local_2c0,local_280[0],(size_t *)0x0);
  if ((cVar7 == 0) && (1 < local_2c0)) {
    pcVar3 = (dumpDirectory->_M_dataplus)._M_p;
    local_340 = &local_330;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_340,pcVar3,pcVar3 + dumpDirectory->_M_string_length);
    std::__cxx11::string::append((char *)&local_340);
    std::ofstream::ofstream(&local_230,(string *)&local_340,_S_out|_S_bin);
    if (local_340 != &local_330) {
      operator_delete(local_340);
    }
    std::ostream::write((char *)&local_230,(long)local_280[0]);
    local_230 = _VTT;
    *(CLIntercept **)(local_228 + *(long *)(_VTT + -0x18) + -8) = _dlclose;
    std::filebuf::~filebuf(local_228);
    std::ios_base::~ios_base(local_138);
  }
  else {
    local_34c = 0;
    (*(this->m_Dispatch).clGetProgramInfo)(local_348,0x1162,4,&local_34c,(size_t *)0x0);
    std::vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>::vector
              (&local_248,(ulong)local_34c,(allocator_type *)&local_230);
    (*(this->m_Dispatch).clGetProgramInfo)
              (local_348,0x1163,(ulong)local_34c << 3,
               local_248.super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>.
               _M_impl.super__Vector_impl_data._M_start,(size_t *)0x0);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&local_260,(ulong)local_34c,(allocator_type *)&local_230);
    (*(this->m_Dispatch).clGetProgramInfo)
              (local_348,0x1165,(ulong)local_34c << 3,
               local_260.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,(size_t *)0x0);
    local_298.
    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_298.
    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_298.
    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_2d8.super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (uchar **)0x0;
    local_2d8.super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_2d8.super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (uchar **)0x0;
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::reserve(&local_298,(ulong)local_34c);
    std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::reserve
              (&local_2d8,(ulong)local_34c);
    local_320 = this;
    if (local_34c == 0) {
      sVar15 = 0;
    }
    else {
      lVar14 = 0;
      sVar15 = 0;
      uVar13 = 0;
      do {
        std::
        vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
        ::emplace_back<unsigned_long&>
                  ((vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    *)&local_298,
                   (unsigned_long *)
                   ((long)local_260.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start + sVar15));
        local_230 = *(uchar **)
                     ((long)&((local_298.
                               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                             _M_impl.super__Vector_impl_data._M_start + lVar14);
        if (local_2d8.super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_2d8.super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_char*,std::allocator<unsigned_char*>>::
          _M_realloc_insert<unsigned_char*>
                    ((vector<unsigned_char*,std::allocator<unsigned_char*>> *)&local_2d8,
                     (iterator)
                     local_2d8.super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_230);
        }
        else {
          *local_2d8.super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
           super__Vector_impl_data._M_finish = local_230;
          local_2d8.super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_2d8.super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>.
               _M_impl.super__Vector_impl_data._M_finish + 1;
        }
        uVar13 = uVar13 + 1;
        sVar15 = sVar15 + 8;
        lVar14 = lVar14 + 0x18;
      } while (uVar13 != local_34c);
    }
    cVar7 = (*(local_320->m_Dispatch).clGetProgramInfo)
                      (local_348,0x1166,sVar15,
                       local_2d8.
                       super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl
                       .super__Vector_impl_data._M_start,(size_t *)0x0);
    puVar5 = _VTT;
    if ((cVar7 == 0) && (local_34c != 0)) {
      local_320 = _dlclose;
      uVar13 = 0;
      do {
        pcVar3 = (dumpDirectory->_M_dataplus)._M_p;
        local_2b8 = local_2a8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2b8,pcVar3,pcVar3 + dumpDirectory->_M_string_length);
        std::__cxx11::string::append((char *)&local_2b8);
        cVar12 = '\x01';
        if (9 < uVar13) {
          uVar10 = uVar13;
          cVar6 = '\x04';
          do {
            cVar12 = cVar6;
            if (uVar10 < 100) {
              cVar12 = cVar12 + -2;
              goto LAB_0017ceaa;
            }
            if (uVar10 < 1000) {
              cVar12 = cVar12 + -1;
              goto LAB_0017ceaa;
            }
            if (uVar10 < 10000) goto LAB_0017ceaa;
            bVar4 = 99999 < uVar10;
            uVar10 = uVar10 / 10000;
            cVar6 = cVar12 + '\x04';
          } while (bVar4);
          cVar12 = cVar12 + '\x01';
        }
LAB_0017ceaa:
        local_2f8 = local_2e8;
        std::__cxx11::string::_M_construct((ulong)&local_2f8,cVar12);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_2f8,local_2f0,uVar13);
        uVar10 = 0xf;
        if (local_2b8 != local_2a8) {
          uVar10 = local_2a8[0];
        }
        uVar2 = CONCAT44(uStack_2ec,local_2f0) + local_2b0;
        if (uVar10 < uVar2) {
          uVar10 = 0xf;
          if (local_2f8 != local_2e8) {
            uVar10 = local_2e8[0];
          }
          if (uVar10 < uVar2) goto LAB_0017cf21;
          puVar8 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_2f8,0,(char *)0x0,(ulong)local_2b8);
        }
        else {
LAB_0017cf21:
          puVar8 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_2b8,(ulong)local_2f8);
        }
        local_318 = &local_308;
        puVar1 = puVar8 + 2;
        if ((undefined8 *)*puVar8 == puVar1) {
          local_308 = *puVar1;
          uStack_300 = puVar8[3];
        }
        else {
          local_308 = *puVar1;
          local_318 = (undefined8 *)*puVar8;
        }
        local_310 = puVar8[1];
        *puVar8 = puVar1;
        puVar8[1] = 0;
        *(undefined1 *)puVar1 = 0;
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_318);
        local_340 = &local_330;
        plVar11 = plVar9 + 2;
        if ((long *)*plVar9 == plVar11) {
          local_330 = *plVar11;
          lStack_328 = plVar9[3];
        }
        else {
          local_330 = *plVar11;
          local_340 = (long *)*plVar9;
        }
        local_338 = plVar9[1];
        *plVar9 = (long)plVar11;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        std::ofstream::ofstream(&local_230,(string *)&local_340,_S_out|_S_bin);
        if (local_340 != &local_330) {
          operator_delete(local_340);
        }
        if (local_318 != &local_308) {
          operator_delete(local_318);
        }
        if (local_2f8 != local_2e8) {
          operator_delete(local_2f8);
        }
        if (local_2b8 != local_2a8) {
          operator_delete(local_2b8);
        }
        std::ostream::write((char *)&local_230,
                            (long)local_298.
                                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar13].
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
        local_230 = puVar5;
        *(CLIntercept **)(local_228 + *(long *)(puVar5 + -0x18) + -8) = local_320;
        std::filebuf::~filebuf(local_228);
        std::ios_base::~ios_base(local_138);
        uVar13 = uVar13 + 1;
      } while (uVar13 != local_34c);
    }
    if (local_2d8.super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2d8.
                      super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::~vector(&local_298);
    if (local_260.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_260.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_248.super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_248.
                      super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  if (local_280[0] != local_270) {
    operator_delete(local_280[0]);
  }
  return;
}

Assistant:

void CLIntercept::dumpCaptureReplayKernelSource(
    const std::string& dumpDirectory,
    cl_kernel kernel )
{
    cl_program program = nullptr;
    dispatch().clGetKernelInfo(kernel, CL_KERNEL_PROGRAM, sizeof(cl_program), &program, nullptr);

    size_t size = 0;
    dispatch().clGetProgramInfo(program, CL_PROGRAM_SOURCE, 0, nullptr, &size);

    std::string sourceCode(size, ' ');
    int error = dispatch().clGetProgramInfo(program, CL_PROGRAM_SOURCE, size, &sourceCode[0], nullptr);
    if( error == CL_SUCCESS && size > 1 )
    {
        std::ofstream output(dumpDirectory + "kernel.cl", std::ios::out | std::ios::binary);
        output.write(sourceCode.c_str(), size);
    }
    else
    {
        cl_uint num_devices = 0;
        dispatch().clGetProgramInfo(program, CL_PROGRAM_NUM_DEVICES, sizeof(cl_uint), &num_devices, nullptr);

        std::vector<cl_device_id> devices(num_devices);
        dispatch().clGetProgramInfo(program, CL_PROGRAM_DEVICES, num_devices * sizeof(cl_device_id), devices.data(), 0);

        std::vector<size_t> sizes(num_devices);
        dispatch().clGetProgramInfo(program, CL_PROGRAM_BINARY_SIZES, num_devices * sizeof(size_t), sizes.data(), nullptr);

        std::vector<std::vector<unsigned char>> binaries;
        std::vector<unsigned char*> binariesData;
        binaries.reserve(num_devices);
        binariesData.reserve(num_devices);
        for( size_t device = 0; device != num_devices; ++device )
        {
            binaries.emplace_back(sizes[device]);
            binariesData.emplace_back(binaries[device].data());
        }

        error = dispatch().clGetProgramInfo(program, CL_PROGRAM_BINARIES, num_devices * sizeof(unsigned char*), binariesData.data(), nullptr);
        if( error == CL_SUCCESS )
        {
            for (size_t device = 0; device != num_devices; ++device)
            {
                std::ofstream output(dumpDirectory + "DeviceBinary" + std::to_string(device) + ".bin", std::ios::out | std::ios::binary);
                output.write(reinterpret_cast<char const*>(binaries[device].data()), binaries[device].size());
            }
        }
    }
}